

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O0

int bssl::dtls1_dispatch_alert(SSL *ssl)

{
  SSL *this;
  uint16_t uVar1;
  pointer bio;
  size_t in_R9;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  int iStack_40;
  int alert;
  uchar *local_38;
  int local_30 [2];
  undefined8 local_28;
  int local_1c;
  SSL *pSStack_18;
  int ret;
  SSL *ssl_local;
  
  pSStack_18 = ssl;
  Span<unsigned_char_const>::Span<2ul>((Span<unsigned_char_const> *)local_30,&ssl->s3->send_alert);
  uVar1 = DTLSWriteEpoch::epoch(&pSStack_18->d1->write_epoch);
  in.size_._0_2_ = uVar1;
  in.data_ = (uchar *)local_28;
  in.size_._2_6_ = 0;
  local_1c = dtls1_write_record((bssl *)ssl,(SSL *)0x15,local_30[0],in,(uint16_t)in_R9);
  ssl_local._4_4_ = local_1c;
  if (0 < local_1c) {
    *(ushort *)&pSStack_18->s3->field_0xdc = *(ushort *)&pSStack_18->s3->field_0xdc & 0xfbff;
    if (pSStack_18->s3->send_alert[0] == '\x02') {
      bio = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&pSStack_18->wbio);
      BIO_flush(bio);
    }
    this = pSStack_18;
    Span<unsigned_char_const>::Span<2ul>
              ((Span<unsigned_char_const> *)&iStack_40,&pSStack_18->s3->send_alert);
    in_00.size_ = in_R9;
    in_00.data_ = local_38;
    ssl_do_msg_callback((bssl *)this,(SSL *)0x1,0x15,iStack_40,in_00);
    ssl_do_info_callback
              (pSStack_18,0x4008,
               (uint)CONCAT11(pSStack_18->s3->send_alert[0],pSStack_18->s3->send_alert[1]));
    ssl_local._4_4_ = 1;
  }
  return ssl_local._4_4_;
}

Assistant:

int dtls1_dispatch_alert(SSL *ssl) {
  int ret = dtls1_write_record(ssl, SSL3_RT_ALERT, ssl->s3->send_alert,
                               ssl->d1->write_epoch.epoch());
  if (ret <= 0) {
    return ret;
  }
  ssl->s3->alert_dispatch = false;

  // If the alert is fatal, flush the BIO now.
  if (ssl->s3->send_alert[0] == SSL3_AL_FATAL) {
    BIO_flush(ssl->wbio.get());
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_ALERT, ssl->s3->send_alert);

  int alert = (ssl->s3->send_alert[0] << 8) | ssl->s3->send_alert[1];
  ssl_do_info_callback(ssl, SSL_CB_WRITE_ALERT, alert);

  return 1;
}